

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

int __thiscall mpt::slice::set(slice *this,convertable *src)

{
  int iVar1;
  size_t sVar2;
  int len;
  convertable *src_local;
  slice *this_local;
  
  iVar1 = array::set(&this->super_array,src);
  if (-1 < iVar1) {
    this->_off = 0;
    sVar2 = array::length(&this->super_array);
    this->_len = sVar2;
  }
  return iVar1;
}

Assistant:

int slice::set(convertable &src)
{
	int len = array::set(src);
	if (len < 0) {
		return len;
	}
	_off = 0;
	_len = length();
	return len;
}